

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  GlobInternals *pGVar1;
  cmCPackLog *pcVar2;
  char cVar3;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  char *pcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar11;
  _func_int **pp_Var12;
  _func_int **pp_Var13;
  pointer filename;
  char *pcVar14;
  string tmpPF;
  ostringstream cmCPackLog_msg;
  Glob gl;
  string findExpr;
  undefined1 auStack_278 [8];
  long *local_270 [2];
  long local_260 [2];
  string local_250;
  char *local_230;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [6];
  ios_base local_1b8 [264];
  undefined1 local_b0 [48];
  bool local_80;
  bool local_5f;
  string *local_58;
  string local_50;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_228,"Create package using ",0x15);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_228,(this->Name)._M_dataplus._M_p,
                      (this->Name)._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  uVar5 = local_b0._0_8_;
  sVar9 = strlen((char *)local_b0._0_8_);
  cmCPackLog::Log(pcVar2,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x403,(char *)uVar5,sVar9);
  pGVar1 = (GlobInternals *)(local_b0 + 0x10);
  if ((GlobInternals *)local_b0._0_8_ != pGVar1) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  iVar7 = PrepareNames(this);
  if (iVar7 == 0) {
    return 0;
  }
  iVar7 = (*(this->super_cmObject)._vptr_cmObject[7])(this);
  if (iVar7 == 0) {
    return 0;
  }
  local_228._0_8_ = local_228 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"CPACK_REMOVE_TOPLEVEL_DIRECTORY","");
  pcVar10 = GetOption(this,(string *)local_228);
  bVar6 = cmSystemTools::IsOn(pcVar10);
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1));
  }
  if (bVar6) {
    local_228._0_8_ = local_228 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,"CPACK_TOPLEVEL_DIRECTORY","");
    pcVar10 = GetOption(this,(string *)local_228);
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1));
    }
    bVar6 = cmsys::SystemTools::FileExists(pcVar10);
    if (bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"Remove toplevel directory: ",0x1b);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)auStack_278 + (int)*(_func_int **)(local_228._0_8_ + -0x18) + 0x50);
      }
      else {
        sVar9 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar10,sVar9);
      }
      std::ios::widen((char)(ostringstream *)local_228 +
                      (char)*(_func_int **)(local_228._0_8_ + -0x18));
      std::ostream::put((char)local_228);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar5 = local_b0._0_8_;
      sVar9 = strlen((char *)local_b0._0_8_);
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x41b,(char *)uVar5,sVar9);
      if ((GlobInternals *)local_b0._0_8_ != pGVar1) {
        operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
      std::ios_base::~ios_base(local_1b8);
      bVar6 = cmSystemTools::RepeatedRemoveDirectory(pcVar10);
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"Problem removing toplevel directory: ",0x25);
        if (pcVar10 == (char *)0x0) {
          std::ios::clear((int)auStack_278 + (int)*(_func_int **)(local_228._0_8_ + -0x18) + 0x50);
        }
        else {
          sVar9 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar10,sVar9);
        }
        std::ios::widen((char)(ostringstream *)local_228 +
                        (char)*(_func_int **)(local_228._0_8_ + -0x18));
        std::ostream::put((char)local_228);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar5 = local_b0._0_8_;
        sVar9 = strlen((char *)local_b0._0_8_);
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x421,(char *)uVar5,sVar9);
        if ((GlobInternals *)local_b0._0_8_ != pGVar1) {
          operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
        std::ios_base::~ios_base(local_1b8);
        return 0;
      }
    }
  }
  pp_Var13 = (_func_int **)(local_228 + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_228,"About to install project ",0x19);
  std::ios::widen((char)(ostringstream *)local_228 + (char)*(_func_int **)(local_228._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_228);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  uVar5 = local_b0._0_8_;
  sVar9 = strlen((char *)local_b0._0_8_);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x427,(char *)uVar5,sVar9);
  if ((GlobInternals *)local_b0._0_8_ != pGVar1) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  iVar7 = InstallProject(this);
  if (iVar7 == 0) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_228,"Done install project ",0x15);
  std::ios::widen((char)(ostringstream *)local_228 + (char)*(_func_int **)(local_228._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_228);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  uVar5 = local_b0._0_8_;
  sVar9 = strlen((char *)local_b0._0_8_);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x42e,(char *)uVar5,sVar9);
  if ((GlobInternals *)local_b0._0_8_ != pGVar1) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  local_228._0_8_ = pp_Var13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  pcVar10 = GetOption(this,(string *)local_228);
  if ((_func_int **)local_228._0_8_ != pp_Var13) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1));
  }
  local_228._0_8_ = pp_Var13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"CPACK_TEMPORARY_DIRECTORY","");
  local_230 = GetOption(this,(string *)local_228);
  if ((_func_int **)local_228._0_8_ != pp_Var13) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"Find files",10);
  std::ios::widen((char)(ostringstream *)local_228 + (char)*(_func_int **)(local_228._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_228);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  uVar5 = local_b0._0_8_;
  sVar9 = strlen((char *)local_b0._0_8_);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x435,(char *)uVar5,sVar9);
  if ((GlobInternals *)local_b0._0_8_ != pGVar1) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  cmsys::Glob::Glob((Glob *)local_b0);
  std::__cxx11::string::string((string *)&local_50,local_230,(allocator *)local_228);
  std::__cxx11::string::append((char *)&local_50);
  local_b0[8] = true;
  local_5f = true;
  local_80 = false;
  bVar6 = cmsys::Glob::FindFiles((Glob *)local_b0,&local_50,(GlobMessages *)0x0);
  if (bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"Create package",0xe);
    std::ios::widen((char)(ostream *)local_228 + (char)*(_func_int **)(local_228._0_8_ + -0x18));
    std::ostream::put((char)local_228);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    plVar11 = local_270[0];
    sVar9 = strlen((char *)local_270[0]);
    cmCPackLog::Log(pcVar2,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x443,(char *)plVar11,sVar9);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0],local_260[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"Package files to: ",0x12);
    pcVar14 = pcVar10;
    if (pcVar10 == (char *)0x0) {
      pcVar14 = "(NULL)";
    }
    sVar9 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar9);
    std::ios::widen((char)(ostream *)local_228 + (char)*(_func_int **)(local_228._0_8_ + -0x18));
    std::ostream::put((char)local_228);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    plVar11 = local_270[0];
    sVar9 = strlen((char *)local_270[0]);
    cmCPackLog::Log(pcVar2,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x445,(char *)plVar11,sVar9);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0],local_260[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
    bVar6 = cmsys::SystemTools::FileExists(pcVar10);
    if (bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"Remove old package file",0x17);
      std::ios::widen((char)(ostream *)local_228 + (char)*(_func_int **)(local_228._0_8_ + -0x18));
      std::ostream::put((char)local_228);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      plVar11 = local_270[0];
      sVar9 = strlen((char *)local_270[0]);
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x449,(char *)plVar11,sVar9);
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
      std::ios_base::~ios_base(local_1b8);
      std::__cxx11::string::string((string *)local_228,pcVar10,(allocator *)local_270);
      cmsys::SystemTools::RemoveFile((string *)local_228);
      if ((_func_int **)local_228._0_8_ != pp_Var13) {
        operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1));
      }
    }
    local_228._0_8_ = pp_Var13;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY","");
    pcVar14 = GetOption(this,(string *)local_228);
    bVar6 = cmSystemTools::IsOn(pcVar14);
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1));
    }
    pp_Var13 = (_func_int **)(local_228 + 0x10);
    if (bVar6) {
      local_228._0_8_ = pp_Var13;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_228,"CPACK_TOPLEVEL_DIRECTORY","");
      local_230 = GetOption(this,(string *)local_228);
      if ((_func_int **)local_228._0_8_ != pp_Var13) {
        operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1));
      }
    }
    __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->files,__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->packageFileNames,
                      (this->packageFileNames).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    pcVar14 = "";
    if (pcVar10 != (char *)0x0) {
      pcVar14 = pcVar10;
    }
    local_228._0_8_ = pp_Var13;
    sVar9 = strlen(pcVar14);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,pcVar14,pcVar14 + sVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->packageFileNames,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    if ((_func_int **)local_228._0_8_ != pp_Var13) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1));
    }
    pcVar14 = local_230;
    pcVar10 = (char *)(this->toplevel)._M_string_length;
    strlen(local_230);
    std::__cxx11::string::_M_replace((ulong)&this->toplevel,0,pcVar10,(ulong)pcVar14);
    iVar7 = (*(this->super_cmObject)._vptr_cmObject[10])(this);
    if ((((iVar7 != 0) && (cmSystemTools::s_ErrorOccured == false)) &&
        (cmSystemTools::s_FatalErrorOccured == false)) &&
       (bVar6 = cmSystemTools::GetInterruptFlag(), !bVar6)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"Copying final package(s) [",0x1a);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_228);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]:",2);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      plVar11 = local_270[0];
      sVar9 = strlen((char *)local_270[0]);
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x46c,(char *)plVar11,sVar9);
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
      std::ios_base::~ios_base(local_1b8);
      filename = (this->packageFileNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (filename ==
          (this->packageFileNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar7 = 1;
      }
      else {
        do {
          pp_Var13 = (_func_int **)(local_228 + 0x10);
          local_228._0_8_ = pp_Var13;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"CPACK_OUTPUT_FILE_PREFIX","");
          pcVar10 = GetOption(this,(string *)local_228);
          std::__cxx11::string::string((string *)local_270,pcVar10,(allocator *)&local_250);
          if ((_func_int **)local_228._0_8_ != pp_Var13) {
            operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1))
            ;
          }
          local_230 = (filename->_M_dataplus)._M_p;
          cmsys::SystemTools::GetFilenameName(&local_250,filename);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x554003);
          pp_Var12 = (_func_int **)(plVar11 + 2);
          if ((_func_int **)*plVar11 == pp_Var12) {
            local_218[0]._0_8_ = *pp_Var12;
            local_218[0]._8_8_ = plVar11[3];
            local_228._0_8_ = pp_Var13;
          }
          else {
            local_218[0]._0_8_ = *pp_Var12;
            local_228._0_8_ = (_func_int **)*plVar11;
          }
          local_228._8_8_ = plVar11[1];
          *plVar11 = (long)pp_Var12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_270,local_228._0_8_);
          local_58 = filename;
          if ((_func_int **)local_228._0_8_ != pp_Var13) {
            operator_delete((void *)local_228._0_8_,(ulong)(local_218[0]._M_allocated_capacity + 1))
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          plVar11 = local_270[0];
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"Copy final package(s): ",0x17);
          pcVar10 = local_230;
          if (local_230 == (pointer)0x0) {
            pcVar10 = "(NULL)";
          }
          sVar9 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar10,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228," to ",4);
          pcVar14 = (char *)plVar11;
          if (plVar11 == (long *)0x0) {
            pcVar14 = "(NULL)";
          }
          sVar9 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar9);
          cVar3 = (char)(string *)local_228;
          std::ios::widen((char)*(_func_int **)(local_228._0_8_ + -0x18) + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var4._M_p = local_250._M_dataplus._M_p;
          sVar9 = strlen(local_250._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x479,_Var4._M_p,sVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
          std::ios_base::~ios_base(local_1b8);
          bVar6 = cmSystemTools::CopyFileIfDifferent(local_230,(char *)plVar11);
          if (bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,"- package: ",0xb);
            if (plVar11 == (long *)0x0) {
              std::ios::clear((int)auStack_278 + (int)*(_func_int **)(local_228._0_8_ + -0x18) +
                              0x50);
            }
            else {
              sVar9 = strlen((char *)plVar11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,(char *)plVar11,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228," generated.",0xb);
            cVar3 = (char)(ostringstream *)local_228;
            std::ios::widen((char)*(_func_int **)(local_228._0_8_ + -0x18) + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            _Var4._M_p = local_250._M_dataplus._M_p;
            sVar9 = strlen(local_250._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x486,_Var4._M_p,sVar9);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,"Problem copying the package: ",0x1d);
            sVar9 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar10,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228," to ",4);
            sVar9 = strlen(pcVar14);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar14,sVar9);
            cVar3 = (char)(ostringstream *)local_228;
            std::ios::widen((char)*(_func_int **)(local_228._0_8_ + -0x18) + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            _Var4._M_p = local_250._M_dataplus._M_p;
            sVar9 = strlen(local_250._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x481,_Var4._M_p,sVar9);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
          std::ios_base::~ios_base(local_1b8);
          if (local_270[0] != local_260) {
            operator_delete(local_270[0],local_260[0] + 1);
          }
          if (!bVar6) goto LAB_002422d1;
          filename = local_58 + 1;
          iVar7 = 1;
        } while (filename !=
                 (this->packageFileNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      goto LAB_002422d4;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"Problem compressing the directory",0x21);
    std::ios::widen((char)(ostream *)local_228 + (char)*(_func_int **)(local_228._0_8_ + -0x18));
    std::ostream::put((char)local_228);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    plVar11 = local_270[0];
    sVar9 = strlen((char *)local_270[0]);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x460,(char *)plVar11,sVar9);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"Cannot find any files in the packaging tree",0x2b);
    std::ios::widen((char)(ostream *)local_228 + (char)*(_func_int **)(local_228._0_8_ + -0x18));
    std::ostream::put((char)local_228);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    plVar11 = local_270[0];
    sVar9 = strlen((char *)local_270[0]);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x43f,(char *)plVar11,sVar9);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
LAB_002422d1:
  iVar7 = 0;
LAB_002422d4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cmsys::Glob::~Glob((Glob *)local_b0);
  return iVar7;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
    "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if ( !this->PrepareNames() )
    {
    return 0;
    }

  // Digest Component grouping specification
  if ( !this->PrepareGroupingKind() )
    {
    return 0;
    }

  if ( cmSystemTools::IsOn(
      this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY")) )
    {
    const char* toplevelDirectory
      = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if ( cmSystemTools::FileExists(toplevelDirectory) )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: "
        << toplevelDirectory << std::endl);
      if ( !cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory) )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Problem removing toplevel directory: "
          << toplevelDirectory
          << std::endl);
        return 0;
        }
      }
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if ( !this->InstallProject() )
    {
    return 0;
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Done install project " << std::endl);


  const char* tempPackageFileName = this->GetOption(
    "CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  const char* tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = tempDirectory;
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  gl.SetRecurseThroughSymlinks(false);
  if ( !gl.FindFiles(findExpr) )
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
      "Cannot find any files in the packaging tree" << std::endl);
    return 0;
    }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Package files to: "
    << (tempPackageFileName ? tempPackageFileName : "(NULL)") << std::endl);
  if ( cmSystemTools::FileExists(tempPackageFileName) )
    {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Remove old package file"
      << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
    }
  if ( cmSystemTools::IsOn(this->GetOption(
        "CPACK_INCLUDE_TOPLEVEL_DIRECTORY")) )
    {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    }

  // The files to be installed
  files = gl.GetFiles();

  packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  packageFileNames.push_back(tempPackageFileName ? tempPackageFileName : "");
  toplevel = tempDirectory;
  if ( !this->PackageFiles() || cmSystemTools::GetErrorOccuredFlag())
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem compressing the directory"
      << std::endl);
    return 0;
    }

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Copying final package(s) ["
                   <<packageFileNames.size()
                   <<"]:"<<std::endl);
  std::vector<std::string>::iterator it;
  /* now copy package one by one */
  for (it=packageFileNames.begin();it!=packageFileNames.end();++it)
    {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    tempPackageFileName = it->c_str();
    tmpPF += "/"+cmSystemTools::GetFilenameName(*it);
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "Copy final package(s): "
        << (tempPackageFileName ? tempPackageFileName : "(NULL)" )
        << " to "
        << (packageFileName ? packageFileName : "(NULL)")
        << std::endl);
    if ( !cmSystemTools::CopyFileIfDifferent(tempPackageFileName,
        packageFileName) )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem copying the package: "
          << (tempPackageFileName ? tempPackageFileName : "(NULL)" )
          << " to "
          << (packageFileName ? packageFileName : "(NULL)")
          << std::endl);
      return 0;
      }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- package: "
        << packageFileName
        << " generated." << std::endl);
    }

  return 1;
}